

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_newextlstr(lua_State *L,char *s,size_t len,lua_Alloc falloc,void *ud)

{
  uint uVar1;
  TStatus TVar2;
  TString *pTVar3;
  ls_byte local_50 [8];
  char *local_48;
  size_t local_40;
  TString *local_38;
  
  if (len < 0x29) {
    local_48 = s;
    local_40 = len;
    if (falloc == (lua_Alloc)0x0) {
      pTVar3 = internshrstr(L,s,len);
      return pTVar3;
    }
    TVar2 = luaD_rawrunprotected(L,f_pintern,local_50);
    (*falloc)(ud,s,len + 1,0);
    if (TVar2 != '\0') {
LAB_00118696:
      luaD_throw(L,'\x04');
    }
  }
  else {
    if (falloc == (lua_Alloc)0x0) {
      uVar1 = L->l_G->seed;
      local_38 = (TString *)luaC_newobj(L,'\x14',0x20);
      local_38->hash = uVar1;
      local_38->extra = '\0';
      local_50[0] = -2;
    }
    else {
      local_50[0] = -3;
      TVar2 = luaD_rawrunprotected(L,f_newext,local_50);
      if (TVar2 != '\0') {
        (*falloc)(ud,s,len + 1,0);
        goto LAB_00118696;
      }
      local_38->falloc = falloc;
      local_38->ud = ud;
    }
    local_38->shrlen = local_50[0];
    (local_38->u).lnglen = len;
    local_38->contents = s;
  }
  return local_38;
}

Assistant:

TString *luaS_newextlstr (lua_State *L,
	          const char *s, size_t len, lua_Alloc falloc, void *ud) {
  struct NewExt ne;
  if (len <= LUAI_MAXSHORTLEN) {  /* short string? */
    ne.s = s; ne.len = len;
    if (!falloc)
      f_pintern(L, &ne);  /* just internalize string */
    else {
      TStatus status = luaD_rawrunprotected(L, f_pintern, &ne);
      (*falloc)(ud, cast_voidp(s), len + 1, 0);  /* free external string */
      if (status != LUA_OK)  /* memory error? */
        luaM_error(L);  /* re-raise memory error */
    }
    return ne.ts;
  }
  /* "normal" case: long strings */
  if (!falloc) {
    ne.kind = LSTRFIX;
    f_newext(L, &ne);  /* just create header */
  }
  else {
    ne.kind = LSTRMEM;
    if (luaD_rawrunprotected(L, f_newext, &ne) != LUA_OK) {  /* mem. error? */
      (*falloc)(ud, cast_voidp(s), len + 1, 0);  /* free external string */
      luaM_error(L);  /* re-raise memory error */
    }
    ne.ts->falloc = falloc;
    ne.ts->ud = ud;
  }
  ne.ts->shrlen = ne.kind;
  ne.ts->u.lnglen = len;
  ne.ts->contents = cast_charp(s);
  return ne.ts;
}